

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.cpp
# Opt level: O2

bool __thiscall
slang::analysis::FlowAnalysisBase::isFullyCovered(FlowAnalysisBase *this,CaseStatement *stmt)

{
  char *pcVar1;
  pair<unsigned_int,_unsigned_int> pVar2;
  uint uVar3;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> sVar4;
  bool bVar5;
  undefined1 uVar6;
  uint uVar7;
  bitwidth_t bVar8;
  Expression *pEVar9;
  pointer pIVar10;
  ConstantValue *pCVar11;
  size_t sVar12;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_00;
  Diagnostic *pDVar13;
  Diagnostic *this_01;
  Type *pTVar14;
  DiagCode code;
  ulong uVar15;
  byte bVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long lVar17;
  ulong uVar18;
  CaseStatement *source;
  ulong uVar19;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ulong pos0;
  Symbol *pSVar20;
  long lVar21;
  CaseStatement *pCVar22;
  pointer this_02;
  double extraout_XMM0_Qa;
  double dVar23;
  undefined1 auVar24 [16];
  double extraout_XMM0_Qa_00;
  undefined1 auVar25 [16];
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  string_view sVar42;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar43;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  CaseStatementCondition cond;
  bitwidth_t bitWidth;
  Symbol *local_430;
  CaseStatement *local_428;
  Type *local_420;
  ulong local_418;
  FlowAnalysisBase *local_410;
  Symbol *local_408;
  uint local_3fc;
  undefined8 local_3f8;
  EvalContext *local_3f0;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __begin4;
  table_element_pointer local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  __index_type local_3c8;
  Expression *item;
  StatementSyntax *local_388;
  SourceLocation local_380;
  Expression local_378;
  pointer local_340;
  pointer local_338;
  ulong local_330;
  ulong local_328;
  string msg;
  anon_class_40_5_99d61402 makeDecisionDag;
  string local_2d8;
  undefined1 local_2b8;
  undefined1 uStack_2b7;
  undefined1 uStack_2b6;
  undefined1 uStack_2b5;
  undefined1 uStack_2b4;
  undefined1 uStack_2b3;
  undefined1 uStack_2b2;
  undefined1 uStack_2b1;
  undefined1 uStack_2b0;
  undefined1 uStack_2af;
  undefined1 uStack_2ae;
  undefined1 uStack_2ad;
  undefined1 uStack_2ac;
  undefined1 uStack_2ab;
  undefined1 uStack_2aa;
  undefined1 uStack_2a9;
  undefined1 local_2a8;
  undefined1 uStack_2a7;
  undefined1 uStack_2a6;
  undefined1 uStack_2a5;
  undefined1 uStack_2a4;
  undefined1 uStack_2a3;
  undefined1 uStack_2a2;
  undefined1 uStack_2a1;
  undefined1 uStack_2a0;
  undefined1 uStack_29f;
  undefined1 uStack_29e;
  undefined1 uStack_29d;
  undefined1 uStack_29c;
  undefined1 uStack_29b;
  undefined1 uStack_29a;
  undefined1 uStack_299;
  SmallVector<slang::SVInt,_2UL> intVals;
  SmallVector<const_slang::ast::Expression_*,_5UL> itemExpressions;
  optional<slang::analysis::CaseDecisionDag> decisionDag;
  SmallMap<slang::ConstantValue,_const_slang::ast::Expression_*,_4UL,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  elems;
  
  local_420 = (stmt->expr->type).ptr;
  source = stmt;
  pEVar9 = ast::Expression::unwrapImplicitConversions(stmt->expr);
  bitWidth = ast::Type::getBitWidth((pEVar9->type).ptr);
  cond = stmt->condition;
  local_3fc = cond - WildcardXOrZ;
  SmallMap<slang::ConstantValue,_const_slang::ast::Expression_*,_4UL,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  ::SmallMap(&elems);
  intVals.super_SmallVectorBase<slang::SVInt>.data_ =
       (pointer)intVals.super_SmallVectorBase<slang::SVInt>.firstElement;
  intVals.super_SmallVectorBase<slang::SVInt>.len = 0;
  intVals.super_SmallVectorBase<slang::SVInt>.cap = 2;
  itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  pIVar10 = (stmt->items)._M_ptr;
  local_340 = pIVar10 + (stmt->items)._M_extent._M_extent_value;
  local_3f0 = &this->evalContext;
  local_3f8 = 0;
  local_428 = stmt;
  local_410 = this;
  while (makeDecisionDag.decisionDag = &decisionDag, pIVar10 != local_340) {
    pSVar20 = (Symbol *)(pIVar10->expressions)._M_ptr;
    local_408 = (Symbol *)
                ((long)&(((Variant *)&pSVar20->kind)->
                        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        ).
                        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                + (pIVar10->expressions)._M_extent._M_extent_value * 8);
    local_338 = pIVar10;
    for (; pSVar20 != local_408; pSVar20 = (Symbol *)&pSVar20->name) {
      source = *(CaseStatement **)pSVar20;
      item = (Expression *)source;
      pCVar11 = ast::Expression::eval((ConstantValue *)&decisionDag,(Expression *)source,local_3f0);
      if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
          _M_payload.super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
          super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.field2[0x20] ==
          '\0') {
        local_3f8 = CONCAT71((int7)((ulong)pCVar11 >> 8),1);
      }
      else {
        sVar12 = boost::unordered::detail::foa::mulx_mix::
                 mix<slang::hash<slang::ConstantValue,void>,slang::ConstantValue>
                           ((hash<slang::ConstantValue,_void> *)&elems.super_Storage.field_0xc8,
                            (ConstantValue *)&decisionDag);
        pos0 = sVar12 >> (elems._208_1_ & 0x3f);
        lVar17 = (sVar12 & 0xff) * 4;
        uVar26 = (&UNK_004a00ac)[lVar17];
        uVar27 = (&UNK_004a00ad)[lVar17];
        uVar28 = (&UNK_004a00ae)[lVar17];
        uVar29 = (&UNK_004a00af)[lVar17];
        uVar19 = (ulong)((uint)sVar12 & 7);
        uVar15 = 0;
        uVar18 = pos0;
        uVar30 = uVar26;
        uVar31 = uVar27;
        uVar32 = uVar28;
        uVar33 = uVar29;
        uVar34 = uVar26;
        uVar35 = uVar27;
        uVar36 = uVar28;
        uVar37 = uVar29;
        uVar38 = uVar26;
        uVar39 = uVar27;
        uVar40 = uVar28;
        uVar41 = uVar29;
        local_430 = pSVar20;
        do {
          pcVar1 = (char *)(elems._224_8_ + uVar18 * 0x10);
          local_2a8 = *pcVar1;
          uStack_2a7 = pcVar1[1];
          uStack_2a6 = pcVar1[2];
          uStack_2a5 = pcVar1[3];
          uStack_2a4 = pcVar1[4];
          uStack_2a3 = pcVar1[5];
          uStack_2a2 = pcVar1[6];
          uStack_2a1 = pcVar1[7];
          uStack_2a0 = pcVar1[8];
          uStack_29f = pcVar1[9];
          uStack_29e = pcVar1[10];
          uStack_29d = pcVar1[0xb];
          uStack_29c = pcVar1[0xc];
          uStack_29b = pcVar1[0xd];
          uStack_29a = pcVar1[0xe];
          uVar6 = pcVar1[0xf];
          auVar24[0] = -(local_2a8 == uVar26);
          auVar24[1] = -(uStack_2a7 == uVar27);
          auVar24[2] = -(uStack_2a6 == uVar28);
          auVar24[3] = -(uStack_2a5 == uVar29);
          auVar24[4] = -(uStack_2a4 == uVar30);
          auVar24[5] = -(uStack_2a3 == uVar31);
          auVar24[6] = -(uStack_2a2 == uVar32);
          auVar24[7] = -(uStack_2a1 == uVar33);
          auVar24[8] = -(uStack_2a0 == uVar34);
          auVar24[9] = -(uStack_29f == uVar35);
          auVar24[10] = -(uStack_29e == uVar36);
          auVar24[0xb] = -(uStack_29d == uVar37);
          auVar24[0xc] = -(uStack_29c == uVar38);
          auVar24[0xd] = -(uStack_29b == uVar39);
          auVar24[0xe] = -(uStack_29a == uVar40);
          auVar24[0xf] = -(uVar6 == uVar41);
          uVar7 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
          uStack_299 = uVar6;
          if (uVar7 != 0) {
            lVar21 = elems._224_8_ + uVar18 * 0x10;
            lVar17 = elems._232_8_ + uVar18 * 0x2d0;
            local_418 = uVar15;
            local_378.sourceRange.startLoc._0_1_ = uVar26;
            local_378.sourceRange.startLoc._1_1_ = uVar27;
            local_378.sourceRange.startLoc._2_1_ = uVar28;
            local_378.sourceRange.startLoc._3_1_ = uVar29;
            local_378.sourceRange.startLoc._4_1_ = uVar30;
            local_378.sourceRange.startLoc._5_1_ = uVar31;
            local_378.sourceRange.startLoc._6_1_ = uVar32;
            local_378.sourceRange.startLoc._7_1_ = uVar33;
            local_378.sourceRange.endLoc._0_1_ = uVar34;
            local_378.sourceRange.endLoc._1_1_ = uVar35;
            local_378.sourceRange.endLoc._2_1_ = uVar36;
            local_378.sourceRange.endLoc._3_1_ = uVar37;
            local_378.sourceRange.endLoc._4_1_ = uVar38;
            local_378.sourceRange.endLoc._5_1_ = uVar39;
            local_378.sourceRange.endLoc._6_1_ = uVar40;
            local_378.sourceRange.endLoc._7_1_ = uVar41;
            local_330 = uVar19;
            local_328 = uVar18;
            do {
              uVar3 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              pCVar22 = (CaseStatement *)((ulong)uVar3 * 0x30 + lVar17);
              source = pCVar22;
              bVar5 = slang::operator==((ConstantValue *)&decisionDag,(ConstantValue *)pCVar22);
              this = local_410;
              if (bVar5) {
                pSVar20 = local_430;
                if (local_410->diagnostics != (Diagnostics *)0x0) {
                  pDVar13 = Diagnostics::add(local_410->diagnostics,local_410->rootSymbol,
                                             (DiagCode)0xd000e,item->sourceRange);
                  pSVar20 = local_430;
                  sVar42 = ast::SemanticFacts::getCaseConditionStr(cond);
                  this_01 = Diagnostic::operator<<(pDVar13,sVar42);
                  Diagnostic::operator<<(this_01,(ConstantValue *)pCVar22);
                  source = (CaseStatement *)0xc0001;
                  Diagnostic::addNote(pDVar13,(DiagCode)0xc0001,
                                      *(SourceRange *)
                                       &(pCVar22->items)._M_ptr[1].expressions._M_extent);
                }
                goto LAB_0046c2bb;
              }
              uVar7 = uVar7 - 1 & uVar7;
            } while (uVar7 != 0);
            uVar6 = *(byte *)(lVar21 + 0xf);
            uVar15 = local_418;
            uVar18 = local_328;
            uVar19 = local_330;
            uVar26 = local_378.sourceRange.startLoc._0_1_;
            uVar27 = local_378.sourceRange.startLoc._1_1_;
            uVar28 = local_378.sourceRange.startLoc._2_1_;
            uVar29 = local_378.sourceRange.startLoc._3_1_;
            uVar30 = local_378.sourceRange.startLoc._4_1_;
            uVar31 = local_378.sourceRange.startLoc._5_1_;
            uVar32 = local_378.sourceRange.startLoc._6_1_;
            uVar33 = local_378.sourceRange.startLoc._7_1_;
            uVar34 = local_378.sourceRange.endLoc._0_1_;
            uVar35 = local_378.sourceRange.endLoc._1_1_;
            uVar36 = local_378.sourceRange.endLoc._2_1_;
            uVar37 = local_378.sourceRange.endLoc._3_1_;
            uVar38 = local_378.sourceRange.endLoc._4_1_;
            uVar39 = local_378.sourceRange.endLoc._5_1_;
            uVar40 = local_378.sourceRange.endLoc._6_1_;
            uVar41 = local_378.sourceRange.endLoc._7_1_;
          }
          this = local_410;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[uVar19] & uVar6) == None >> 0x18) break;
          lVar17 = uVar18 + uVar15;
          uVar15 = uVar15 + 1;
          uVar18 = lVar17 + 1U & elems._216_8_;
        } while (uVar15 <= (ulong)elems._216_8_);
        if ((ulong)elems._248_8_ < (ulong)elems._240_8_) {
          source = (CaseStatement *)&elems.super_Storage.field_0xc8;
          in_R9.values_ = (value<fmt::v11::context> *)&decisionDag;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
                    ((locator *)&__begin4,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
                      *)source,pos0,sVar12,(try_emplace_args_t *)&makeDecisionDag,
                     (ConstantValue *)in_R9.values_,&item);
        }
        else {
          source = (CaseStatement *)&elems.super_Storage.field_0xc8;
          in_R9.values_ = (value<fmt::v11::context> *)&item;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
                    ((locator *)&__begin4,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
                      *)source,sVar12,(try_emplace_args_t *)&makeDecisionDag,
                     (ConstantValue *)&decisionDag,(Expression **)in_R9.values_);
        }
        pSVar20 = local_430;
        if ((*(__index_type *)(local_3d8._M_allocated_capacity + 0x20) == '\x01') &&
           ((this_00 = std::
                       get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                 ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)local_3d8._M_allocated_capacity), dVar23 = extraout_XMM0_Qa,
            cond != WildcardJustZ ||
            (bVar8 = SVInt::countXs(this_00), dVar23 = extraout_XMM0_Qa_00, bVar8 == 0)))) {
          SVInt::trunc((SVInt *)&__begin4,dVar23);
          SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt>
                    (&intVals.super_SmallVectorBase<slang::SVInt>,(SVInt *)&__begin4);
          SVInt::~SVInt((SVInt *)&__begin4);
          source = (CaseStatement *)&item;
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*const&>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)&itemExpressions,
                     (Expression **)source);
        }
      }
LAB_0046c2bb:
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&decisionDag);
      if (((this->diagnostics != (Diagnostics *)0x0) && ((cond & ~WildcardJustZ) == Normal)) &&
         (pEVar9 = ast::Expression::unwrapImplicitConversions(item), pEVar9->kind == IntegerLiteral)
         ) {
        if (cond == Normal) {
          source = (CaseStatement *)&pEVar9[1].type;
          SVInt::SVInt((SVInt *)&decisionDag,(SVIntStorage *)source);
          uVar26 = decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                   _M_payload.
                   super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
                   super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.field2
                   [0xd];
          SVInt::~SVInt((SVInt *)&decisionDag);
          code.subsystem = Analysis;
          code.code = 0x11;
          if (uVar26 == '\0') goto LAB_0046c323;
LAB_0046c352:
          source = (CaseStatement *)this->rootSymbol;
          Diagnostics::add(this->diagnostics,(Symbol *)source,code,item->sourceRange);
        }
        else {
LAB_0046c323:
          if (cond == WildcardJustZ) {
            source = (CaseStatement *)&pEVar9[1].type;
            SVInt::SVInt((SVInt *)&decisionDag,(SVIntStorage *)source);
            bVar8 = SVInt::countXs((SVInt *)&decisionDag);
            SVInt::~SVInt((SVInt *)&decisionDag);
            code.subsystem = Analysis;
            code.code = 0x14;
            if (bVar8 != 0) goto LAB_0046c352;
          }
        }
      }
    }
    pIVar10 = local_338 + 1;
  }
  decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>._M_payload.
  super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
  super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_engaged = false;
  makeDecisionDag.intVals = &intVals;
  makeDecisionDag.bitWidth = &bitWidth;
  makeDecisionDag.cond = &cond;
  makeDecisionDag.this = this;
  if (this->diagnostics != (Diagnostics *)0x0) {
    bVar5 = ast::Type::isEnum(local_420);
    if (bVar5) {
      item = &local_378;
      local_388 = (StatementSyntax *)0x0;
      local_380 = (SourceLocation)0x2;
      pTVar14 = ast::Type::getCanonicalType(local_420);
      sVar43 = ast::Scope::membersOfType<slang::ast::EnumValueSymbol>
                         ((Scope *)&pTVar14[1].super_Symbol.name);
      local_408 = (Symbol *)sVar43._M_end.current;
      __begin4.current = sVar43._M_begin.current.current;
      while (sVar4.current = __begin4.current, __begin4.current != local_408) {
        local_430 = (Symbol *)
                    ast::EnumValueSymbol::getValue(__begin4.current,(SourceRange)ZEXT816(0));
        sVar12 = boost::unordered::detail::foa::mulx_mix::
                 mix<slang::hash<slang::ConstantValue,void>,slang::ConstantValue>
                           ((hash<slang::ConstantValue,_void> *)&elems.super_Storage.field_0xc8,
                            (ConstantValue *)local_430);
        uVar18 = sVar12 >> (elems._208_1_ & 0x3f);
        lVar17 = (sVar12 & 0xff) * 4;
        uVar26 = (&UNK_004a00ac)[lVar17];
        uVar27 = (&UNK_004a00ad)[lVar17];
        uVar28 = (&UNK_004a00ae)[lVar17];
        uVar29 = (&UNK_004a00af)[lVar17];
        uVar15 = 0;
        uVar30 = uVar26;
        uVar31 = uVar27;
        uVar32 = uVar28;
        uVar33 = uVar29;
        uVar34 = uVar26;
        uVar35 = uVar27;
        uVar36 = uVar28;
        uVar37 = uVar29;
        uVar38 = uVar26;
        uVar39 = uVar27;
        uVar40 = uVar28;
        uVar41 = uVar29;
        do {
          pcVar1 = (char *)(elems._224_8_ + uVar18 * 0x10);
          local_2b8 = *pcVar1;
          uStack_2b7 = pcVar1[1];
          uStack_2b6 = pcVar1[2];
          uStack_2b5 = pcVar1[3];
          uStack_2b4 = pcVar1[4];
          uStack_2b3 = pcVar1[5];
          uStack_2b2 = pcVar1[6];
          uStack_2b1 = pcVar1[7];
          uStack_2b0 = pcVar1[8];
          uStack_2af = pcVar1[9];
          uStack_2ae = pcVar1[10];
          uStack_2ad = pcVar1[0xb];
          uStack_2ac = pcVar1[0xc];
          uStack_2ab = pcVar1[0xd];
          uStack_2aa = pcVar1[0xe];
          uVar6 = pcVar1[0xf];
          auVar25[0] = -(local_2b8 == uVar26);
          auVar25[1] = -(uStack_2b7 == uVar27);
          auVar25[2] = -(uStack_2b6 == uVar28);
          auVar25[3] = -(uStack_2b5 == uVar29);
          auVar25[4] = -(uStack_2b4 == uVar30);
          auVar25[5] = -(uStack_2b3 == uVar31);
          auVar25[6] = -(uStack_2b2 == uVar32);
          auVar25[7] = -(uStack_2b1 == uVar33);
          auVar25[8] = -(uStack_2b0 == uVar34);
          auVar25[9] = -(uStack_2af == uVar35);
          auVar25[10] = -(uStack_2ae == uVar36);
          auVar25[0xb] = -(uStack_2ad == uVar37);
          auVar25[0xc] = -(uStack_2ac == uVar38);
          auVar25[0xd] = -(uStack_2ab == uVar39);
          auVar25[0xe] = -(uStack_2aa == uVar40);
          auVar25[0xf] = -(uVar6 == uVar41);
          uVar7 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
          uStack_2a9 = uVar6;
          if (uVar7 != 0) {
            lVar21 = elems._224_8_ + uVar18 * 0x10;
            lVar17 = elems._232_8_ + uVar18 * 0x2d0;
            local_418 = uVar15;
            local_378.sourceRange.startLoc._0_1_ = uVar26;
            local_378.sourceRange.startLoc._1_1_ = uVar27;
            local_378.sourceRange.startLoc._2_1_ = uVar28;
            local_378.sourceRange.startLoc._3_1_ = uVar29;
            local_378.sourceRange.startLoc._4_1_ = uVar30;
            local_378.sourceRange.startLoc._5_1_ = uVar31;
            local_378.sourceRange.startLoc._6_1_ = uVar32;
            local_378.sourceRange.startLoc._7_1_ = uVar33;
            local_378.sourceRange.endLoc._0_1_ = uVar34;
            local_378.sourceRange.endLoc._1_1_ = uVar35;
            local_378.sourceRange.endLoc._2_1_ = uVar36;
            local_378.sourceRange.endLoc._3_1_ = uVar37;
            local_378.sourceRange.endLoc._4_1_ = uVar38;
            local_378.sourceRange.endLoc._5_1_ = uVar39;
            local_378.sourceRange.endLoc._6_1_ = uVar40;
            local_378.sourceRange.endLoc._7_1_ = uVar41;
            do {
              uVar3 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              source = (CaseStatement *)((ulong)uVar3 * 0x30 + lVar17);
              bVar5 = slang::operator==((ConstantValue *)local_430,(ConstantValue *)source);
              if (bVar5) goto LAB_0046c59d;
              uVar7 = uVar7 - 1 & uVar7;
            } while (uVar7 != 0);
            uVar6 = *(byte *)(lVar21 + 0xf);
            uVar15 = local_418;
            uVar26 = local_378.sourceRange.startLoc._0_1_;
            uVar27 = local_378.sourceRange.startLoc._1_1_;
            uVar28 = local_378.sourceRange.startLoc._2_1_;
            uVar29 = local_378.sourceRange.startLoc._3_1_;
            uVar30 = local_378.sourceRange.startLoc._4_1_;
            uVar31 = local_378.sourceRange.startLoc._5_1_;
            uVar32 = local_378.sourceRange.startLoc._6_1_;
            uVar33 = local_378.sourceRange.startLoc._7_1_;
            uVar34 = local_378.sourceRange.endLoc._0_1_;
            uVar35 = local_378.sourceRange.endLoc._1_1_;
            uVar36 = local_378.sourceRange.endLoc._2_1_;
            uVar37 = local_378.sourceRange.endLoc._3_1_;
            uVar38 = local_378.sourceRange.endLoc._4_1_;
            uVar39 = local_378.sourceRange.endLoc._5_1_;
            uVar40 = local_378.sourceRange.endLoc._6_1_;
            uVar41 = local_378.sourceRange.endLoc._7_1_;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)sVar12 & 7] & uVar6) == None >> 0x18
             ) break;
          lVar17 = uVar18 + uVar15;
          uVar15 = uVar15 + 1;
          uVar18 = lVar17 + 1U & elems._216_8_;
        } while (uVar15 <= (ulong)elems._216_8_);
        source = (CaseStatement *)&(sVar4.current)->name;
        SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)&item,
                   (basic_string_view<char,_std::char_traits<char>_> *)source);
LAB_0046c59d:
        ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>::increment(&__begin4);
        this = local_410;
      }
      if (local_388 != (StatementSyntax *)0x0) {
        msg._M_dataplus._M_p = (pointer)&msg.field_2;
        msg._M_string_length = 0;
        msg.field_2._M_local_buf[0] = '\0';
        if (local_388 == (StatementSyntax *)0x3) {
          local_3e0 = *(table_element_pointer *)item;
          __begin4.current = &((item->type).ptr)->super_Symbol;
          local_3c8 = SUB81((item->sourceRange).endLoc,0);
          fmt_01.size_ = 0xddd;
          fmt_01.data_ = (char *)0x1b;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)&__begin4;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_2d8,(v11 *)"values \'{}\', \'{}\', and \'{}\'",fmt_01,args_01);
LAB_0046c755:
          __str = &local_2d8;
        }
        else {
          if (local_388 == (StatementSyntax *)0x2) {
            local_3e0 = *(table_element_pointer *)item;
            __begin4.current = &((item->type).ptr)->super_Symbol;
            fmt_00.size_ = 0xdd;
            fmt_00.data_ = (char *)0x14;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)&__begin4;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_2d8,(v11 *)"values \'{}\' and \'{}\'",fmt_00,args_00);
            goto LAB_0046c755;
          }
          if (local_388 != (StatementSyntax *)0x1) {
            local_3e0 = *(table_element_pointer *)item;
            __begin4.current = &((item->type).ptr)->super_Symbol;
            local_3c8 = SUB81((item->sourceRange).endLoc,0);
            fmt_02.size_ = 0xc4ddd;
            fmt_02.data_ = (char *)0x28;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&__begin4;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_2d8,(v11 *)"values \'{}\', \'{}\', \'{}\' (and {} other{})",fmt_02,
                       args_02);
            goto LAB_0046c755;
          }
          local_2d8._M_string_length = *(size_type *)item;
          local_2d8._M_dataplus._M_p = (pointer)(item->type).ptr;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0xa;
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)&local_2d8;
          ::fmt::v11::vformat_abi_cxx11_((string *)&__begin4,(v11 *)0x4b6a7e,fmt,args);
          __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin4;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&msg,__str);
        std::__cxx11::string::~string((string *)__str);
        pDVar13 = Diagnostics::add(this->diagnostics,this->rootSymbol,
                                   (DiagCode)
                                   ((uint)(local_428->defaultCase != (Statement *)0x0) << 0x10 |
                                   0xe000e),local_428->expr->sourceRange);
        source = (CaseStatement *)&msg;
        Diagnostic::operator<<(pDVar13,(string *)source);
        std::__cxx11::string::~string((string *)&msg);
      }
      SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
                ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)&item,
                 (EVP_PKEY_CTX *)source);
    }
    if (local_3fc < 2) {
      isFullyCovered::anon_class_40_5_99d61402::operator()(&makeDecisionDag);
      if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
          _M_payload.super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
          super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload._M_value.gaveUp
          == true) {
        pDVar13 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0xc000e,
                                   local_428->expr->sourceRange);
        sVar42 = ast::SemanticFacts::getCaseConditionStr(cond);
        source = (CaseStatement *)sVar42._M_len;
        Diagnostic::operator<<(pDVar13,sVar42);
      }
      else {
        if ((decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
             _M_payload.
             super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
             super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload._M_value.
             counterexample.super__Optional_base<slang::SVInt,_false,_false>._M_payload.
             super__Optional_payload<slang::SVInt,_true,_false,_false>.
             super__Optional_payload_base<slang::SVInt>._M_engaged == true) &&
           (local_428->defaultCase == (Statement *)0x0)) {
          pDVar13 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0x10000e,
                                     local_428->expr->sourceRange);
          sVar42 = ast::SemanticFacts::getCaseConditionStr(cond);
          Diagnostic::operator<<(pDVar13,sVar42);
          std::__detail::__variant::
          _Variant_storage<false,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
          ::_Variant_storage<1ul,slang::SVInt_const&>
                    ((_Variant_storage<false,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                      *)&__begin4,
                     (undefined1 *)
                     ((long)&decisionDag.
                             super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                             _M_payload.
                             super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                             .super__Optional_payload_base<slang::analysis::CaseDecisionDag>.
                             _M_payload + 0x60));
          source = (CaseStatement *)&__begin4;
          Diagnostic::operator<<(pDVar13,(ConstantValue *)source);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&__begin4);
        }
        ___begin4 = (undefined1  [16])
                    boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::begin((table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&decisionDag);
        while (local_3e0 != (table_element_pointer)0x0) {
          pDVar13 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0x13000e,
                                     itemExpressions.
                                     super_SmallVectorBase<const_slang::ast::Expression_*>.data_
                                     [local_3e0->first]->sourceRange);
          sVar42 = ast::SemanticFacts::getCaseConditionStr(cond);
          source = (CaseStatement *)sVar42._M_len;
          Diagnostic::operator<<(pDVar13,sVar42);
          boost::unordered::detail::foa::
          table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
          ::increment((table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                       *)&__begin4);
        }
        ___begin4 = (undefined1  [16])
                    boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::begin(&decisionDag.
                             super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                             _M_payload.
                             super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>
                             .super__Optional_payload_base<slang::analysis::CaseDecisionDag>.
                             _M_payload._M_value.overlappingClauses.table_);
        while (local_3e0 != (table_element_pointer)0x0) {
          pVar2 = *local_3e0;
          pDVar13 = Diagnostics::add(this->diagnostics,this->rootSymbol,(DiagCode)0x12000e,
                                     itemExpressions.
                                     super_SmallVectorBase<const_slang::ast::Expression_*>.data_
                                     [(ulong)pVar2 >> 0x20]->sourceRange);
          sVar42 = ast::SemanticFacts::getCaseConditionStr(cond);
          pDVar13 = Diagnostic::operator<<(pDVar13,sVar42);
          source = (CaseStatement *)0xc0001;
          Diagnostic::addNote(pDVar13,(DiagCode)0xc0001,
                              itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>.
                              data_[(ulong)pVar2 & 0xffffffff]->sourceRange);
          boost::unordered::detail::foa::
          table_iterator<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
          ::increment((table_iterator<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                       *)&__begin4);
        }
      }
    }
  }
  if ((((this->options).flags.m_bits & 2) != 0) &&
     (bVar16 = 1, (local_428->check | Unique0) == Priority)) goto LAB_0046c892;
  bVar5 = ast::Type::isIntegral(local_420);
  pCVar22 = local_428;
  if (((~bVar5 | (byte)local_3f8) & 1) == 0) {
    source = (CaseStatement *)local_428->expr;
    ast::Expression::eval((ConstantValue *)&__begin4,(Expression *)source,local_3f0);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&__begin4);
    if (pCVar22->condition != Inside && local_3c8 == '\0') {
      uVar7 = (this->options).flags.m_bits;
      if ((pCVar22->condition != Normal) && (bVar5 = ast::Type::isFourState(local_420), bVar5)) {
        if ((uVar7 & 4) == 0) {
          if (decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
              _M_payload.
              super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
              super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_engaged == false) {
            isFullyCovered::anon_class_40_5_99d61402::operator()(&makeDecisionDag);
          }
          bVar16 = decisionDag.super__Optional_base<slang::analysis::CaseDecisionDag,_false,_false>.
                   _M_payload.
                   super__Optional_payload<slang::analysis::CaseDecisionDag,_true,_false,_false>.
                   super__Optional_payload_base<slang::analysis::CaseDecisionDag>._M_payload.field2
                   [0x70] ^ 1;
        }
        else {
          lVar17 = intVals.super_SmallVectorBase<slang::SVInt>.len << 4;
          this_02 = intVals.super_SmallVectorBase<slang::SVInt>.data_;
          do {
            bVar16 = lVar17 != 0;
            if (lVar17 == 0) break;
            bVar8 = SVInt::countLeadingZs(this_02);
            this_02 = this_02 + 1;
            lVar17 = lVar17 + -0x10;
          } while (bVar8 < bitWidth);
        }
        goto LAB_0046c892;
      }
      bVar5 = ast::Type::isFourState(local_420);
      if (bVar5 && (uVar7 & 4) != 0) {
        if (bitWidth < 0x10) {
          dVar23 = exp2((double)(int)(bitWidth * 2));
          bVar16 = (ulong)((long)(dVar23 - 9.223372036854776e+18) & (long)dVar23 >> 0x3f |
                          (long)dVar23) <= (ulong)elems._248_8_;
          goto LAB_0046c892;
        }
      }
      else if (bitWidth < 0x20) {
        bVar16 = (ulong)elems._248_8_ >> ((byte)bitWidth & 0x3f) != 0;
        goto LAB_0046c892;
      }
    }
  }
  bVar16 = 0;
LAB_0046c892:
  std::_Optional_payload_base<slang::analysis::CaseDecisionDag>::_M_reset
            ((_Optional_payload_base<slang::analysis::CaseDecisionDag> *)&decisionDag);
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&itemExpressions.super_SmallVectorBase<const_slang::ast::Expression_*>,
             (EVP_PKEY_CTX *)source);
  SmallVectorBase<slang::SVInt>::cleanup
            (&intVals.super_SmallVectorBase<slang::SVInt>,(EVP_PKEY_CTX *)source);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
                 *)&elems.super_Storage.field_0xc8);
  return (bool)bVar16;
}

Assistant:

bool FlowAnalysisBase::isFullyCovered(const CaseStatement& stmt) const {
    // This method determines whether a case statement's items fully cover
    // the input space, so that we know whether the default statement
    // (if there is one) is reachable or not.
    //
    // Also while we're here we will issue some diagnostics for lint issues like
    // overlapping case items and duplicate case items, if this analysis has been
    // configured to report diagnostics.

    const auto& caseType = *stmt.expr.type;
    const auto bitWidth = stmt.expr.unwrapImplicitConversions().type->getBitWidth();
    const auto cond = stmt.condition;
    const bool wildcard = cond == CaseStatementCondition::WildcardXOrZ ||
                          cond == CaseStatementCondition::WildcardJustZ;

    // Collect all constant case values, checking for duplicates and overlaps
    // if we are looking for diagnostics.
    bool hasNonConstItems = false;
    SmallMap<ConstantValue, const Expression*, 4> elems;
    SmallVector<SVInt> intVals;
    SmallVector<const Expression*> itemExpressions;
    for (auto& g : stmt.items) {
        for (auto item : g.expressions) {
            if (auto cv = item->eval(evalContext)) {
                auto [it, inserted] = elems.emplace(std::move(cv), item);
                if (!inserted) {
                    if (diagnostics) {
                        auto& diag = diagnostics->add(rootSymbol, diag::CaseDup, item->sourceRange);
                        diag << SemanticFacts::getCaseConditionStr(cond) << it->first;
                        diag.addNote(diag::NotePreviousUsage, it->second->sourceRange);
                    }
                }
                else if (it->first.isInteger()) {
                    // Save off the values for later use in building the decision
                    // DAG. One weid thing here: if the value has x bits and we're
                    // not in a casex statement we should ignore the item, since we
                    // won't check for coverage of x bits in the decision DAG and these
                    // clauses will show up as unreachable otherwise.
                    auto& val = it->first.integer();
                    if (cond != CaseStatementCondition::WildcardJustZ || val.countXs() == 0) {
                        intVals.push_back(val.trunc(bitWidth));
                        itemExpressions.push_back(item);
                    }
                }
            }
            else {
                hasNonConstItems = true;
            }

            if (diagnostics && (cond == CaseStatementCondition::Normal ||
                                cond == CaseStatementCondition::WildcardJustZ)) {
                // If we're not in a wildcard case we should warn
                // about integer literal items that have unknown bits.
                // Similarly, if we're in a wildcard case with just Zs
                // we should warn if we see Xs.
                auto& unwrapped = item->unwrapImplicitConversions();
                if (unwrapped.kind == ExpressionKind::IntegerLiteral) {
                    auto& lit = unwrapped.as<IntegerLiteral>();
                    if (cond == CaseStatementCondition::Normal && lit.getValue().hasUnknown()) {
                        diagnostics->add(rootSymbol, diag::CaseNotWildcard, item->sourceRange);
                    }
                    else if (cond == CaseStatementCondition::WildcardJustZ &&
                             lit.getValue().countXs() > 0) {
                        diagnostics->add(rootSymbol, diag::CaseZWithX, item->sourceRange);
                    }
                }
            }
        }
    }

    std::optional<CaseDecisionDag> decisionDag;
    auto makeDecisionDag = [&]() {
        decisionDag.emplace(intVals, bitWidth, cond == CaseStatementCondition::WildcardXOrZ,
                            options.maxCaseAnalysisSteps);
    };

    // If diagnostics are enabled do various lint checks now.
    if (diagnostics) {
        // Check for missing enum coverage.
        if (caseType.isEnum()) {
            SmallVector<std::string_view> missing;
            for (auto& ev : caseType.getCanonicalType().as<EnumType>().values()) {
                auto& val = ev.getValue();
                if (!elems.contains(val))
                    missing.push_back(ev.name);
            }

            if (!missing.empty()) {
                std::string msg;
                if (missing.size() == 1) {
                    msg = fmt::format("value '{}'", missing[0]);
                }
                else if (missing.size() == 2) {
                    msg = fmt::format("values '{}' and '{}'", missing[0], missing[1]);
                }
                else if (missing.size() == 3) {
                    msg = fmt::format("values '{}', '{}', and '{}'", missing[0], missing[1],
                                      missing[2]);
                }
                else {
                    const size_t remainder = missing.size() - 3;
                    msg = fmt::format("values '{}', '{}', '{}' (and {} other{})", missing[0],
                                      missing[1], missing[2], remainder, remainder == 1 ? "" : "s");
                }

                auto code = stmt.defaultCase ? diag::CaseEnumExplicit : diag::CaseEnum;
                diagnostics->add(rootSymbol, code, stmt.expr.sourceRange) << msg;
            }
        }

        // If this is a wildcard case statement check for overlaps.
        if (wildcard) {
            makeDecisionDag();

            if (decisionDag->gaveUp) {
                auto& diag = diagnostics->add(rootSymbol, diag::CaseComplex, stmt.expr.sourceRange);
                diag << SemanticFacts::getCaseConditionStr(cond);
            }
            else {
                if (decisionDag->counterexample && !stmt.defaultCase) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseIncomplete,
                                                  stmt.expr.sourceRange);
                    diag << SemanticFacts::getCaseConditionStr(cond);
                    diag << *decisionDag->counterexample;
                }

                for (auto index : decisionDag->unreachableClauses) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseUnreachable,
                                                  itemExpressions[index]->sourceRange);
                    diag << SemanticFacts::getCaseConditionStr(cond);
                }

                for (auto [first, second] : decisionDag->overlappingClauses) {
                    auto& diag = diagnostics->add(rootSymbol, diag::CaseOverlap,
                                                  itemExpressions[second]->sourceRange)
                                 << SemanticFacts::getCaseConditionStr(cond);
                    diag.addNote(diag::NotePreviousUsage, itemExpressions[first]->sourceRange);
                }
            }
        }
    }

    // If the case statement asserts it has full coverage, and our flags allow it,
    // assume full coverage without checking.
    if (options.flags.has(AnalysisFlags::FullCaseUniquePriority) &&
        (stmt.check == UniquePriorityCheck::Unique ||
         stmt.check == UniquePriorityCheck::Priority)) {
        return true;
    }

    // If the case type is not integral then we can never fully satisfy the condition.
    // Non-constant items or constant condition is also not coverable.
    if (!caseType.isIntegral() || hasNonConstItems || stmt.expr.eval(evalContext))
        return false;

    // TODO: handle case inside
    if (stmt.condition == CaseStatementCondition::Inside)
        return false;

    const bool fullCaseFourState = options.flags.has(AnalysisFlags::FullCaseFourState);
    if (stmt.condition == CaseStatementCondition::Normal || !caseType.isFourState()) {
        // The number of non-duplicate elements needs to match the number
        // of possible values for the case expression. This depends on
        // whether the type is 2-state or 4-state.
        if (caseType.isFourState() && fullCaseFourState)
            return bitWidth < 16 && elems.size() >= (size_t)std::pow(4, bitWidth);
        else
            return bitWidth < 32 && elems.size() >= (1ull << bitWidth);
    }

    // If we're checking for four-state wildcard coverage we simply need to
    // find an entry that is all Z bits. This is because Z is always a wildcard,
    // so the only way to specify an entry that hits all Z's will also cover
    // all other bits too.
    if (fullCaseFourState) {
        for (auto& val : intVals) {
            if (val.countLeadingZs() >= bitWidth)
                return true;
        }
        return false;
    }

    // Otherwise do the full wildcard coverage search.
    if (!decisionDag)
        makeDecisionDag();

    return decisionDag->isExhaustive();
}